

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_RST(void)

{
  byte bVar1;
  ulong uVar2;
  byte e;
  
  do {
    bVar1 = GetByteNoMem(&::lp,false);
    if ((bVar1 & 199) != 0) {
      Error("[RST] Illegal operand",::line,PASS3);
      SkipToEol(&::lp);
      return;
    }
    EmitByte(bVar1 + 199,true);
    uVar2 = (*DAT_001e16b0)(&::lp);
  } while ((uVar2 & 1) != 0);
  return;
}

Assistant:

static void OpCode_RST() {
		do {
			byte e = GetByteNoMem(lp);
			if (e&(~0x38)) {	// some bit is set which should be not
				Error("[RST] Illegal operand", line); SkipToEol(lp);
				return;
			} else {			// e == { $00, $08, $10, $18, $20, $28, $30, $38 }
				EmitByte(0xC7 + e, true);
			}
		} while (Options::syx.MultiArg(lp));
	}